

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O3

USTATUS __thiscall
FfsParser::parseCpdRegion
          (FfsParser *this,UByteArray *region,UINT32 localOffset,UModelIndex *parent,
          UModelIndex *index)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  UINT32 *pUVar2;
  anon_struct_4_3_7b74da23_for_Offset aVar3;
  TreeModel *pTVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  UINT8 UVar8;
  int iVar9;
  uint uVar10;
  uint pos;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  char *pcVar14;
  _Alloc_hider _Var15;
  USTATUS UVar16;
  pointer pCVar17;
  uint uVar18;
  pointer pCVar19;
  ulong uVar20;
  long lVar21;
  UINT32 offset;
  uint uVar22;
  size_t __n;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  ulong uVar24;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_> partitions;
  anon_struct_4_3_7b74da23_for_Offset local_200;
  UByteArray entry;
  UByteArray header_1;
  UModelIndex entryIndex;
  CPD_PARTITION_INFO partition;
  UByteArray local_138;
  pointer local_118;
  CBString name;
  CBString info;
  CBString local_d0;
  UModelIndex partitionIndex;
  UByteArray body;
  UByteArray header;
  
  uVar22 = (uint)(region->d)._M_string_length;
  if (uVar22 < 0x10) {
    usprintf((CBString *)&partition,"%s: CPD too small to fit rev1 partition table header",
             "parseCpdRegion");
    msg(this,(CBString *)&partition,parent);
LAB_001383e5:
    Bstrlib::CBString::~CBString((CBString *)&partition);
    return 0xfd;
  }
  local_118 = (region->d)._M_dataplus._M_p;
  if (local_118[8] == '\x01') {
    offset = 0x10;
  }
  else {
    offset = 0;
    if ((local_118[8] == '\x02') && (offset = 0x14, uVar22 < 0x14)) {
      usprintf((CBString *)&partition,"%s: CPD too small to fit rev2 partition table header",
               "parseCpdRegion");
      msg(this,(CBString *)&partition,parent);
      goto LAB_001383e5;
    }
  }
  iVar9 = *(int *)(local_118 + 4);
  pos = iVar9 * 0x18 + offset;
  if (uVar22 < pos) {
    usprintf((CBString *)&partition,"%s: CPD too small to fit the whole partition table",
             "parseCpdRegion");
    msg(this,(CBString *)&partition,parent);
    goto LAB_001383e5;
  }
  UByteArray::left(&header,region,offset);
  UByteArray::mid(&body,region,offset,iVar9 * 0x18);
  usprintf(&name,"CPD partition table");
  usprintf(&info,
           "Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nNumber of entries: %u\nHeader version: %u\nEntry version: %u"
           ,(ulong)pos,pos,(ulong)(uint)header.d._M_string_length,
           (ulong)(uint)header.d._M_string_length,(ulong)(uint)body.d._M_string_length,
           (ulong)(uint)body.d._M_string_length,(ulong)*(uint *)(local_118 + 4),
           (ulong)(byte)local_118[8],(ulong)(byte)local_118[9]);
  pTVar4 = this->model;
  Bstrlib::CBString::CBString((CBString *)&header_1);
  pUVar2 = &partition.ptEntry.Length;
  partition.ptEntry.EntryName[8] = '\0';
  partition.ptEntry.EntryName[9] = '\0';
  partition.ptEntry.EntryName[10] = '\0';
  partition.ptEntry.EntryName[0xb] = '\0';
  partition.ptEntry.Offset = (anon_struct_4_3_7b74da23_for_Offset)0x0;
  partition.ptEntry.Length._0_1_ = 0;
  partition.ptEntry.EntryName._0_8_ = pUVar2;
  TreeModel::addItem((UModelIndex *)&entry,pTVar4,localOffset,'_','\0',&name,(CBString *)&header_1,
                     &info,&header,&body,(UByteArray *)&partition,Fixed,parent,'\0');
  index->m = (TreeModel *)
             CONCAT71(entry.d.field_2._M_allocated_capacity._1_7_,entry.d.field_2._M_local_buf[0]);
  *(pointer *)index = entry.d._M_dataplus._M_p;
  index->i = entry.d._M_string_length;
  if ((UINT32 *)partition.ptEntry.EntryName._0_8_ != pUVar2) {
    operator_delete((void *)partition.ptEntry.EntryName._0_8_);
  }
  Bstrlib::CBString::~CBString((CBString *)&header_1);
  partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (*(int *)(local_118 + 4) != 0) {
    uVar20 = 0;
    _Var15 = body.d._M_dataplus;
    do {
      entry.d._M_dataplus._M_p = (pointer)&entry.d.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&entry,_Var15._M_p);
      usprintf((CBString *)&partition,"%.12s",_Var15._M_p);
      Bstrlib::CBString::operator=(&name,(CBString *)&partition);
      Bstrlib::CBString::~CBString((CBString *)&partition);
      usprintf((CBString *)&header_1,
               "Full size: %Xh (%u)\nEntry offset: %Xh\nEntry length: %Xh\nHuffman compressed: ",
               entry.d._M_string_length & 0xffffffff,entry.d._M_string_length & 0xffffffff,
               (ulong)(*(uint *)((UINT8 *)_Var15._M_p + 0xc) & 0x1ffffff),
               (ulong)*(uint *)((UINT8 *)_Var15._M_p + 0x10));
      pcVar14 = "Yes";
      if ((*(uint *)((UINT8 *)_Var15._M_p + 0xc) >> 0x19 & 1) == 0) {
        pcVar14 = "No";
      }
      Bstrlib::CBString::operator+((CBString *)&partition,(CBString *)&header_1,pcVar14);
      Bstrlib::CBString::operator=(&info,(CBString *)&partition);
      Bstrlib::CBString::~CBString((CBString *)&partition);
      Bstrlib::CBString::~CBString((CBString *)&header_1);
      pTVar4 = this->model;
      Bstrlib::CBString::CBString((CBString *)&local_138);
      partition.ptEntry.EntryName._0_8_ = &partition.ptEntry.Length;
      partition.ptEntry.EntryName[8] = '\0';
      partition.ptEntry.EntryName[9] = '\0';
      partition.ptEntry.EntryName[10] = '\0';
      partition.ptEntry.EntryName[0xb] = '\0';
      partition.ptEntry.Offset = (anon_struct_4_3_7b74da23_for_Offset)0x0;
      partition.ptEntry.Length._0_1_ = 0;
      paVar1 = &header_1.d.field_2;
      header_1.d._M_string_length = 0;
      header_1.d.field_2._M_local_buf[0] = '\0';
      header_1.d._M_dataplus._M_p = (pointer)paVar1;
      TreeModel::addItem(&entryIndex,pTVar4,offset,'`','\0',&name,(CBString *)&local_138,&info,
                         (UByteArray *)&partition,&entry,&header_1,Fixed,index,'\0');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)header_1.d._M_dataplus._M_p != paVar1) {
        operator_delete(header_1.d._M_dataplus._M_p);
      }
      if ((UINT32 *)partition.ptEntry.EntryName._0_8_ != &partition.ptEntry.Length) {
        operator_delete((void *)partition.ptEntry.EntryName._0_8_);
      }
      Bstrlib::CBString::~CBString((CBString *)&local_138);
      if (((*(uint *)((UINT8 *)_Var15._M_p + 0xc) & 0x1ffffff) != 0) &&
         (*(int *)((UINT8 *)_Var15._M_p + 0x10) != 0)) {
        partition.type = 'a';
        partition.ptEntry.EntryName._0_8_ = *(undefined8 *)_Var15._M_p;
        uVar6 = *(undefined8 *)((UINT8 *)_Var15._M_p + 8);
        partition.ptEntry.EntryName._8_2_ = SUB82(uVar6,0);
        partition.ptEntry.EntryName._10_2_ = SUB82((ulong)uVar6 >> 0x10,0);
        partition.ptEntry.Offset = SUB84((ulong)uVar6 >> 0x20,0);
        uVar5 = *(undefined8 *)((UINT8 *)_Var15._M_p + 0x10);
        partition.ptEntry.Length._0_1_ = (undefined1)uVar5;
        partition.ptEntry.Length._1_1_ = (undefined1)((ulong)uVar5 >> 8);
        partition.ptEntry.Length._2_2_ = (undefined2)((ulong)uVar5 >> 0x10);
        partition.ptEntry.Reserved = (UINT32)((ulong)uVar5 >> 0x20);
        partition.index.m = (TreeModel *)CONCAT71(entryIndex.m._1_7_,entryIndex.m._0_1_);
        partition.index.r = entryIndex.r;
        partition.index.c = entryIndex.c;
        partition.index.i = entryIndex.i;
        partition.hasMetaData = false;
        if (partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>>::
          _M_realloc_insert<CPD_PARTITION_INFO_const&>
                    ((vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>> *)&partitions,
                     (iterator)
                     partitions.
                     super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&partition);
        }
        else {
          ((partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->index).m = partition.index.m;
          ((partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->index).r = entryIndex.r;
          ((partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->index).c = entryIndex.c;
          ((partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->index).i = entryIndex.i;
          ((partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->ptEntry).Length = (int)uVar5;
          ((partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->ptEntry).Reserved =
               (int)((ulong)uVar5 >> 0x20);
          (partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
           _M_impl.super__Vector_impl_data._M_finish)->type = (char)0x61;
          (partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
           _M_impl.super__Vector_impl_data._M_finish)->hasMetaData = (bool)(char)(0x61 >> 8);
          *(undefined6 *)
           &(partitions.
             super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>._M_impl.
             super__Vector_impl_data._M_finish)->field_0x1a = partition._26_6_;
          *(undefined8 *)
           ((partitions.
             super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>._M_impl.
             super__Vector_impl_data._M_finish)->ptEntry).EntryName =
               partition.ptEntry.EntryName._0_8_;
          *(undefined8 *)
           (((partitions.
              super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>._M_impl.
              super__Vector_impl_data._M_finish)->ptEntry).EntryName + 8) = uVar6;
          partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               partitions.
               super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>._M_impl
               .super__Vector_impl_data._M_finish + 1;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)entry.d._M_dataplus._M_p != &entry.d.field_2) {
        operator_delete(entry.d._M_dataplus._M_p);
      }
      pCVar19 = partitions.
                super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pCVar17 = partitions.
                super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar20 = uVar20 + 1;
      offset = offset + 0x18;
      _Var15._M_p = (pointer)((UINT8 *)_Var15._M_p + 0x18);
    } while (uVar20 < *(uint *)(local_118 + 4));
    if ((long)partitions.
              super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)partitions.
              super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      uVar20 = ((long)partitions.
                      super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)partitions.
                      super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
      lVar21 = 0x3f;
      if (uVar20 != 0) {
        for (; uVar20 >> lVar21 == 0; lVar21 = lVar21 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<CPD_PARTITION_INFO_*,std::vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (partitions.
                 super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 partitions.
                 super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                 _M_impl.super__Vector_impl_data._M_finish,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<CPD_PARTITION_INFO_*,std::vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pCVar17,pCVar19);
      if (1 < (ulong)(((long)partitions.
                             super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)partitions.
                             super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7))
      {
        uVar22 = 1;
        uVar20 = 1;
        do {
          usprintf((CBString *)&partition,"%.12s",
                   partitions.
                   super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar20);
          Bstrlib::CBString::operator=(&name,(CBString *)&partition);
          Bstrlib::CBString::~CBString((CBString *)&partition);
          bVar7 = Bstrlib::CBString::endsWith(&name,".met");
          if (!bVar7) break;
          UByteArray::mid((UByteArray *)&partition,region,
                          (uint)partitions.
                                super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar20].ptEntry.Offset &
                          0x1ffffff,
                          partitions.
                          super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar20].ptEntry.Length);
          uVar11 = CONCAT22(partition.ptEntry.EntryName._10_2_,partition.ptEntry.EntryName._8_2_);
          uVar10 = 0xffffffff;
          if (uVar11 != 0) {
            uVar12 = 0;
            do {
              uVar13 = *(uint *)(partition.ptEntry.EntryName._0_8_ + 4 + uVar12);
              if (uVar11 - (int)uVar12 < uVar13) break;
              if (*(int *)(partition.ptEntry.EntryName._0_8_ + uVar12) == 10) {
                uVar10 = *(uint *)(partition.ptEntry.EntryName._0_8_ + 0x10 + uVar12);
              }
              uVar13 = uVar13 + (int)uVar12;
              uVar12 = (ulong)uVar13;
            } while (uVar13 < uVar11);
          }
          Bstrlib::CBString::trunc(&name,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
          if (1 < (ulong)(((long)partitions.
                                 super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)partitions.
                                 super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         0x6db6db6db6db6db7)) {
            uVar12 = 1;
            uVar24 = 2;
            do {
              usprintf((CBString *)&entry,"%.12s",
                       partitions.
                       super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar12);
              bVar7 = Bstrlib::CBString::operator==(&name,(CBString *)&entry);
              if (bVar7) {
                pCVar17 = partitions.
                          super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar12;
                if ((partitions.
                     super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar12].ptEntry.Offset.field_0x3 & 2)
                    == 0) {
                  if ((uVar10 != 0xffffffff) &&
                     (uVar11 = (pCVar17->ptEntry).Length, uVar11 != uVar10)) {
                    usprintf((CBString *)&header_1,
                             "%s: partition size mismatch between partition table (%Xh) and partition metadata (%Xh)"
                             ,"parseCpdRegion",(ulong)uVar11,(ulong)uVar10);
                    msg(this,(CBString *)&header_1,
                        &partitions.
                         super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar12].index);
                    Bstrlib::CBString::~CBString((CBString *)&header_1);
                    pCVar17 = partitions.
                              super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar12;
                    goto LAB_00138b0f;
                  }
                }
                else {
LAB_00138b0f:
                  (pCVar17->ptEntry).Length = uVar10;
                }
                partitions.
                super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar12].hasMetaData = true;
                Bstrlib::CBString::~CBString((CBString *)&entry);
                goto LAB_00138b27;
              }
              Bstrlib::CBString::~CBString((CBString *)&entry);
              uVar12 = ((long)partitions.
                              super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)partitions.
                              super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
              bVar7 = uVar24 <= uVar12;
              lVar21 = uVar12 - uVar24;
              uVar12 = uVar24;
              uVar24 = (ulong)((int)uVar24 + 1);
            } while (bVar7 && lVar21 != 0);
          }
          usprintf((CBString *)&entry,"%s: no code partition","parseCpdRegion");
          msg(this,(CBString *)&entry,
              &partitions.
               super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>._M_impl
               .super__Vector_impl_data._M_start[uVar20].index);
          Bstrlib::CBString::~CBString((CBString *)&entry);
LAB_00138b27:
          if ((UINT32 *)partition.ptEntry.EntryName._0_8_ != &partition.ptEntry.Length) {
            operator_delete((void *)partition.ptEntry.EntryName._0_8_);
          }
          uVar22 = uVar22 + 1;
          uVar20 = (ulong)uVar22;
          uVar12 = ((long)partitions.
                          super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)partitions.
                          super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
        } while (uVar20 <= uVar12 && uVar12 - uVar20 != 0);
      }
      UVar16 = 0xfd;
      if (partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_200 = (anon_struct_4_3_7b74da23_for_Offset)(pos & 0x1fffffc);
        do {
          pCVar19 = partitions.
                    super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          pCVar17 = partitions.
                    super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar20 = ((long)partitions.
                          super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)partitions.
                          super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
          lVar21 = 0x3f;
          if (uVar20 != 0) {
            for (; uVar20 >> lVar21 == 0; lVar21 = lVar21 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<CPD_PARTITION_INFO_*,std::vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (partitions.
                     super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     partitions.
                     super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                     _M_impl.super__Vector_impl_data._M_finish,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<CPD_PARTITION_INFO_*,std::vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pCVar17,pCVar19);
          partition.ptEntry.Length._0_1_ = 0;
          partition.ptEntry.Length._1_1_ = 0;
          partition.ptEntry.Length._2_2_ = 0;
          partition.ptEntry.Reserved = 0;
          partition.type = '\0';
          partition.hasMetaData = false;
          partition._26_6_ = 0;
          partition.ptEntry.EntryName[0] = '\0';
          partition.ptEntry.EntryName[1] = '\0';
          partition.ptEntry.EntryName[2] = '\0';
          partition.ptEntry.EntryName[3] = '\0';
          partition.ptEntry.EntryName[4] = '\0';
          partition.ptEntry.EntryName[5] = '\0';
          partition.ptEntry.EntryName[6] = '\0';
          partition.ptEntry.EntryName[7] = '\0';
          partition.ptEntry.EntryName[8] = '\0';
          partition.ptEntry.EntryName[9] = '\0';
          partition.ptEntry.EntryName[10] = '\0';
          partition.ptEntry.EntryName[0xb] = '\0';
          partition.ptEntry.Offset = (anon_struct_4_3_7b74da23_for_Offset)0x0;
          partition.index.r = -1;
          partition.index.c = -1;
          partition.index.i = 0;
          partition.index.m = (TreeModel *)0x0;
          uVar22 = (uint)((partitions.
                           super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->ptEntry).Offset & 0x1ffffff;
          if (uVar22 < pos) {
            usprintf((CBString *)&entry,
                     "%s: CPD partition has intersection with CPD partition table, skipped",
                     "parseCpdRegion");
            msg(this,(CBString *)&entry,
                &(partitions.
                  super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                  _M_impl.super__Vector_impl_data._M_start)->index);
            Bstrlib::CBString::~CBString((CBString *)&entry);
            pCVar17 = partitions.
                      super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1;
            if (pCVar17 !=
                partitions.
                super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              __n = (long)partitions.
                          super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar17;
              pCVar19 = partitions.
                        super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_0013910d:
              memmove(pCVar19,pCVar17,__n);
            }
LAB_0013911a:
            partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 partitions.
                 super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1;
          }
          else {
            if (pos < uVar22) {
              partition.ptEntry.Offset = local_200;
              iVar9 = ((uint)((partitions.
                               super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->ptEntry).Offset &
                      0x1ffffff) - (int)local_200;
              partition.ptEntry.Length._0_1_ = (undefined1)iVar9;
              partition.ptEntry.Length._1_1_ = (undefined1)((uint)iVar9 >> 8);
              partition.ptEntry.Length._2_2_ = (undefined2)((uint)iVar9 >> 0x10);
              partition.type = '@';
              std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::insert
                        (&partitions,
                         (const_iterator)
                         partitions.
                         super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                         ._M_impl.super__Vector_impl_data._M_start,&partition);
            }
            pCVar17 = partitions.
                      super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if ((ulong)(((long)partitions.
                               super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)partitions.
                               super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7)
                < 2) {
LAB_0013919a:
              aVar3 = partitions.
                      super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].ptEntry.Offset;
              uVar22 = partitions.
                       super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].ptEntry.Length;
              iVar9 = (int)(region->d)._M_string_length;
              if ((ulong)((uint)aVar3 & 0x1ffffff) + (ulong)uVar22 < (ulong)(long)iVar9) {
                uVar22 = uVar22 + (int)aVar3 & 0x1ffffff;
                partition.ptEntry.Offset =
                     (anon_struct_4_3_7b74da23_for_Offset)
                     ((uint)partition.ptEntry.Offset & 0xfe000000 | uVar22);
                iVar9 = iVar9 - uVar22;
                partition.ptEntry.Length._0_1_ = (undefined1)iVar9;
                partition.ptEntry.Length._1_1_ = (undefined1)((uint)iVar9 >> 8);
                partition.ptEntry.Length._2_2_ = (undefined2)((uint)iVar9 >> 0x10);
                partition.type = '@';
                if (partitions.
                    super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    partitions.
                    super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>>::
                  _M_realloc_insert<CPD_PARTITION_INFO_const&>
                            ((vector<CPD_PARTITION_INFO_,std::allocator<CPD_PARTITION_INFO_>> *)
                             &partitions,
                             (iterator)
                             partitions.
                             super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,&partition);
                  pCVar17 = partitions.
                            super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                }
                else {
                  ((partitions.
                    super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->index).m = partition.index.m;
                  ((partitions.
                    super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->index).r = partition.index.r;
                  ((partitions.
                    super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->index).c = partition.index.c;
                  ((partitions.
                    super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->index).i = partition.index.i;
                  ((partitions.
                    super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->ptEntry).Length = iVar9;
                  ((partitions.
                    super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->ptEntry).Reserved =
                       partition.ptEntry.Reserved;
                  (partitions.
                   super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                   _M_impl.super__Vector_impl_data._M_finish)->type = 0x40;
                  (partitions.
                   super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                   _M_impl.super__Vector_impl_data._M_finish)->hasMetaData = partition.hasMetaData;
                  *(undefined6 *)
                   &(partitions.
                     super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                     _M_impl.super__Vector_impl_data._M_finish)->field_0x1a = partition._26_6_;
                  *(undefined8 *)
                   ((partitions.
                     super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                     _M_impl.super__Vector_impl_data._M_finish)->ptEntry).EntryName =
                       partition.ptEntry.EntryName._0_8_;
                  *(ulong *)(((partitions.
                               super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                               ._M_impl.super__Vector_impl_data._M_finish)->ptEntry).EntryName + 8)
                       = CONCAT44(partition.ptEntry.Offset,
                                  CONCAT22(partition.ptEntry.EntryName._10_2_,
                                           partition.ptEntry.EntryName._8_2_));
                  partitions.
                  super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       partitions.
                       super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                }
              }
              if (partitions.
                  super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                  _M_impl.super__Vector_impl_data._M_finish == pCVar17) goto LAB_00138cda;
              paVar1 = &local_138.d.field_2;
              lVar21 = 0;
              uVar20 = 0;
              goto LAB_00139278;
            }
            uVar20 = 1;
            lVar21 = 0;
            while( true ) {
              uVar13 = (*(uint *)((pCVar17->ptEntry).EntryName + lVar21 + 0xc) & 0x1ffffff) +
                       *(int *)((pCVar17->ptEntry).EntryName + lVar21 + 0x10);
              uVar22 = *(uint *)(pCVar17[1].ptEntry.EntryName + lVar21 + 0xc);
              uVar10 = *(uint *)(pCVar17[1].ptEntry.EntryName + lVar21 + 0x10);
              uVar11 = uVar22 & 0x1ffffff;
              uVar18 = (uint)(region->d)._M_string_length;
              if ((ulong)(long)(int)uVar18 < (ulong)uVar11 + (ulong)uVar10) {
                if (uVar18 <= uVar11) {
                  usprintf((CBString *)&entry,
                           "%s: CPD partition is located outside of the opened image, skipped",
                           "parseCpdRegion");
                  msg(this,(CBString *)&entry,
                      (UModelIndex *)
                      ((long)(&partitions.
                               super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].ptEntry + 1) +
                      lVar21 + 8));
                  goto LAB_001390dd;
                }
                if (((uVar22 >> 0x19 & 1) == 0) ||
                   (*(UINT8 *)((long)(&pCVar17[1].ptEntry + 1) + lVar21 + 1) != '\0')) {
                  usprintf((CBString *)&entry,
                           "%s: CPD partition can\'t fit into its region, truncated",
                           "parseCpdRegion");
                  msg(this,(CBString *)&entry,
                      (UModelIndex *)
                      ((long)(&partitions.
                               super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].ptEntry + 1) +
                      lVar21 + 8));
                }
                else {
                  usprintf((CBString *)&entry,
                           "%s: CPD partition is compressed but doesn\'t have metadata and can\'t fit into its region, length adjusted"
                           ,"parseCpdRegion");
                  msg(this,(CBString *)&entry,
                      (UModelIndex *)
                      ((long)(&partitions.
                               super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].ptEntry + 1) +
                      lVar21 + 8));
                }
                Bstrlib::CBString::~CBString((CBString *)&entry);
                uVar11 = *(uint *)(partitions.
                                   super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.EntryName +
                                  lVar21 + 0xc) & 0x1ffffff;
                uVar10 = (int)(region->d)._M_string_length - uVar11;
                *(uint *)(partitions.
                          super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.EntryName +
                         lVar21 + 0x10) = uVar10;
                pCVar17 = partitions.
                          super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              }
              if (uVar11 < uVar13) break;
              if (uVar13 < uVar11) {
                partition.ptEntry.Offset =
                     (anon_struct_4_3_7b74da23_for_Offset)
                     ((uint)partition.ptEntry.Offset & 0xfe000000 | uVar13);
                iVar9 = (*(uint *)(pCVar17[1].ptEntry.EntryName + lVar21 + 0xc) & 0x1ffffff) -
                        uVar13;
                partition.ptEntry.Length._0_1_ = (undefined1)iVar9;
                partition.ptEntry.Length._1_1_ = (undefined1)((uint)iVar9 >> 8);
                partition.ptEntry.Length._2_2_ = (undefined2)((uint)iVar9 >> 0x10);
                partition.type = '@';
                std::vector<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>::insert
                          (&partitions,
                           (CPD_PARTITION_INFO_ *)(pCVar17[1].ptEntry.EntryName + lVar21),&partition
                          );
                pCVar17 = partitions.
                          super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              }
              uVar20 = uVar20 + 1;
              lVar21 = lVar21 + 0x38;
              if ((ulong)(((long)partitions.
                                 super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar17 >> 3) *
                         0x6db6db6db6db6db7) <= uVar20) goto LAB_0013919a;
            }
            if ((*(UINT8 *)((long)(&pCVar17->ptEntry + 1) + lVar21 + 1) != '\0') ||
               (((pCVar17->ptEntry).EntryName[lVar21 + 0xf] & 2) == 0)) {
              if (uVar13 < uVar10 + uVar11) {
                usprintf((CBString *)&entry,
                         "%s: CPD partition intersects with previous one, skipped","parseCpdRegion")
                ;
                msg(this,(CBString *)&entry,
                    (UModelIndex *)
                    ((long)(&partitions.
                             super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].ptEntry + 1) + lVar21 + 8)
                   );
              }
              else {
                usprintf((CBString *)&entry,
                         "%s: CPD partition is located inside another CPD partition, skipped",
                         "parseCpdRegion");
                msg(this,(CBString *)&entry,
                    (UModelIndex *)
                    ((long)(&partitions.
                             super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].ptEntry + 1) + lVar21 + 8)
                   );
              }
LAB_001390dd:
              Bstrlib::CBString::~CBString((CBString *)&entry);
              pCVar17 = (pointer)(partitions.
                                  super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[2].ptEntry.EntryName +
                                 lVar21);
              if (pCVar17 !=
                  partitions.
                  super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                pCVar19 = (pointer)(partitions.
                                    super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.EntryName +
                                   lVar21);
                __n = (long)partitions.
                            super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                            ._M_impl.super__Vector_impl_data._M_finish +
                      (-lVar21 -
                      (long)partitions.
                            super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                            ._M_impl.super__Vector_impl_data._M_start) + -0x70;
                goto LAB_0013910d;
              }
              goto LAB_0013911a;
            }
            usprintf((CBString *)&entry,
                     "%s: CPD partition is compressed but doesn\'t have metadata, length adjusted",
                     "parseCpdRegion");
            msg(this,(CBString *)&entry,
                (UModelIndex *)
                ((long)(&(partitions.
                          super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->ptEntry + 1) + lVar21 + 8));
            Bstrlib::CBString::~CBString((CBString *)&entry);
            *(uint *)(((partitions.
                        super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName +
                     lVar21 + 0x10) =
                 (*(uint *)(partitions.
                            super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].ptEntry.EntryName +
                           lVar21 + 0xc) & 0x1ffffff) -
                 (*(uint *)(((partitions.
                              super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName +
                           lVar21 + 0xc) & 0x1ffffff);
          }
        } while (partitions.
                 super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                 _M_impl.super__Vector_impl_data._M_start !=
                 partitions.
                 super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
        UVar16 = 0xfd;
      }
      goto LAB_00138ce0;
    }
  }
  UByteArray::mid((UByteArray *)&partition,region,pos,-1);
  Bstrlib::CBString::CBString((CBString *)&entry,"Padding");
  Bstrlib::CBString::operator=(&name,(CBString *)&entry);
  Bstrlib::CBString::~CBString((CBString *)&entry);
  usprintf((CBString *)&entry,"Full size: %Xh (%u)",
           (ulong)CONCAT22(partition.ptEntry.EntryName._10_2_,partition.ptEntry.EntryName._8_2_));
  Bstrlib::CBString::operator=(&info,(CBString *)&entry);
  Bstrlib::CBString::~CBString((CBString *)&entry);
  pTVar4 = this->model;
  UVar8 = getPaddingType((UByteArray *)&partition);
  Bstrlib::CBString::CBString((CBString *)&entryIndex);
  paVar1 = &entry.d.field_2;
  entry.d._M_string_length = 0;
  entry.d.field_2._M_local_buf[0] = '\0';
  paVar23 = &header_1.d.field_2;
  header_1.d._M_string_length = 0;
  header_1.d.field_2._M_local_buf[0] = '\0';
  entry.d._M_dataplus._M_p = (pointer)paVar1;
  header_1.d._M_dataplus._M_p = (pointer)paVar23;
  TreeModel::addItem((UModelIndex *)&local_138,pTVar4,pos + localOffset,'@',UVar8,&name,
                     (CBString *)&entryIndex,&info,&entry,(UByteArray *)&partition,&header_1,Fixed,
                     parent,'\0');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)header_1.d._M_dataplus._M_p != paVar23) {
    operator_delete(header_1.d._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)entry.d._M_dataplus._M_p != paVar1) {
    operator_delete(entry.d._M_dataplus._M_p);
  }
  Bstrlib::CBString::~CBString((CBString *)&entryIndex);
  if ((UINT32 *)partition.ptEntry.EntryName._0_8_ != &partition.ptEntry.Length) {
    operator_delete((void *)partition.ptEntry.EntryName._0_8_);
  }
  goto LAB_00138cda;
LAB_00139278:
  do {
    paVar23 = &header_1.d.field_2;
    if (*(UINT8 *)((long)(&pCVar17->ptEntry + 1) + lVar21) == '@') {
      UByteArray::mid(&entry,region,
                      *(uint *)((pCVar17->ptEntry).EntryName + lVar21 + 0xc) & 0x1ffffff,
                      *(int32_t *)((pCVar17->ptEntry).EntryName + lVar21 + 0x10));
      Bstrlib::CBString::CBString((CBString *)&header_1,"Padding");
      Bstrlib::CBString::operator=(&name,(CBString *)&header_1);
      Bstrlib::CBString::~CBString((CBString *)&header_1);
      usprintf((CBString *)&header_1,"Full size: %Xh (%u)",entry.d._M_string_length & 0xffffffff);
      Bstrlib::CBString::operator=(&info,(CBString *)&header_1);
      Bstrlib::CBString::~CBString((CBString *)&header_1);
      pTVar4 = this->model;
      uVar22 = *(uint *)(((partitions.
                           super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName +
                        lVar21 + 0xc);
      UVar8 = getPaddingType(&entry);
      Bstrlib::CBString::CBString((CBString *)&local_138);
      header_1.d._M_dataplus._M_p = (pointer)&header_1.d.field_2;
      header_1.d._M_string_length = 0;
      header_1.d.field_2._M_local_buf[0] = '\0';
      entryIndex.i = 0;
      entryIndex.m._0_1_ = 0;
      entryIndex._0_8_ = &entryIndex.m;
      TreeModel::addItem(&partitionIndex,pTVar4,(uVar22 & 0x1ffffff) + localOffset,'@',UVar8,&name,
                         (CBString *)&local_138,&info,&header_1,&entry,(UByteArray *)&entryIndex,
                         Fixed,parent,'\0');
      if ((TreeModel **)entryIndex._0_8_ != &entryIndex.m) {
        operator_delete((void *)entryIndex._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)header_1.d._M_dataplus._M_p != &header_1.d.field_2) {
        operator_delete(header_1.d._M_dataplus._M_p);
      }
      Bstrlib::CBString::~CBString((CBString *)&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)entry.d._M_dataplus._M_p != &entry.d.field_2) {
        operator_delete(entry.d._M_dataplus._M_p);
      }
    }
    else {
      if (*(UINT8 *)((long)(&pCVar17->ptEntry + 1) + lVar21) != 'a') {
        usprintf((CBString *)&entry,"%s: CPD partition of unknown type found","parseCpdRegion");
        msg(this,(CBString *)&entry,parent);
        Bstrlib::CBString::~CBString((CBString *)&entry);
        UVar16 = 0xfd;
        goto LAB_00138ce0;
      }
      UByteArray::mid(&entry,region,
                      *(uint *)((pCVar17->ptEntry).EntryName + lVar21 + 0xc) & 0x1ffffff,
                      *(int32_t *)((pCVar17->ptEntry).EntryName + lVar21 + 0x10));
      usprintf((CBString *)&header_1,"%.12s",
               ((partitions.
                 super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                 _M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName + lVar21);
      Bstrlib::CBString::operator=(&name,(CBString *)&header_1);
      Bstrlib::CBString::~CBString((CBString *)&header_1);
      bVar7 = Bstrlib::CBString::endsWith(&name,".man");
      _Var15 = entry.d._M_dataplus;
      if (bVar7) {
        if ((((((partitions.
                 super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                 _M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName[lVar21 + 0xf] & 2) ==
              0) && (0x7f < *(uint *)(((partitions.
                                        super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->ptEntry).
                                      EntryName + lVar21 + 0x10))) &&
           (*(int *)(entry.d._M_dataplus._M_p + 0x1c) == 0x324e4d24)) {
          UByteArray::left(&header_1,&entry,*(int *)(entry.d._M_dataplus._M_p + 4) << 2);
          UByteArray::mid((UByteArray *)&entryIndex,&entry,*(int *)(_Var15._M_p + 4) << 2,-1);
          local_118 = (pointer)(ulong)*(uint *)(_Var15._M_p + 0xc);
          usprintf((CBString *)&local_138,
                   "Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nHeader type: %u\nHeader length: %Xh (%u)\nHeader version: %Xh\nFlags: %08Xh\nVendor: %Xh\nDate: %Xh\nSize: %Xh (%u)\nVersion: %u.%u.%u.%u\nSecurity version number: %u\nModulus size: %Xh (%u)\nExponent size: %Xh (%u)"
                   ,entry.d._M_string_length & 0xffffffff,entry.d._M_string_length & 0xffffffff,
                   header_1.d._M_string_length & 0xffffffff,header_1.d._M_string_length & 0xffffffff
                   ,entryIndex.i & 0xffffffff,entryIndex.i & 0xffffffff,(ulong)*(uint *)_Var15._M_p,
                   (ulong)(uint)(*(int *)(_Var15._M_p + 4) << 2),
                   (ulong)(uint)(*(int *)(_Var15._M_p + 4) << 2),(ulong)*(uint *)(_Var15._M_p + 8),
                   local_118,(ulong)*(uint *)(_Var15._M_p + 0x10),
                   (ulong)*(uint *)(_Var15._M_p + 0x14),
                   (ulong)(uint)(*(int *)(_Var15._M_p + 0x18) << 2),
                   (ulong)(uint)(*(int *)(_Var15._M_p + 0x18) << 2),
                   (ulong)*(ushort *)(_Var15._M_p + 0x24),(ulong)*(ushort *)(_Var15._M_p + 0x26),
                   (ulong)*(ushort *)(_Var15._M_p + 0x28),(ulong)*(ushort *)(_Var15._M_p + 0x2a),
                   (ulong)*(uint *)(_Var15._M_p + 0x2c),
                   (ulong)(uint)(*(int *)(_Var15._M_p + 0x78) << 2),
                   (ulong)(uint)(*(int *)(_Var15._M_p + 0x78) << 2),
                   (ulong)(uint)(*(int *)(_Var15._M_p + 0x7c) << 2),
                   (ulong)(uint)(*(int *)(_Var15._M_p + 0x7c) << 2));
          Bstrlib::CBString::operator=(&info,(CBString *)&local_138);
          Bstrlib::CBString::~CBString((CBString *)&local_138);
          pTVar4 = this->model;
          uVar22 = *(uint *)(((partitions.
                               super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName +
                            lVar21 + 0xc);
          Bstrlib::CBString::CBString(&local_d0);
          local_138.d._M_string_length = 0;
          local_138.d.field_2._M_local_buf[0] = '\0';
          local_138.d._M_dataplus._M_p = (pointer)paVar1;
          TreeModel::addItem(&partitionIndex,pTVar4,(uVar22 & 0x1ffffff) + localOffset,'a',0xe6,
                             &name,&local_d0,&info,&header_1,(UByteArray *)&entryIndex,&local_138,
                             Fixed,parent,'\0');
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138.d._M_dataplus._M_p != paVar1) {
            operator_delete(local_138.d._M_dataplus._M_p);
          }
          Bstrlib::CBString::~CBString(&local_d0);
          parseCpdExtensionsArea(this,&partitionIndex,(UINT32)header_1.d._M_string_length);
          if ((TreeModel **)entryIndex._0_8_ != &entryIndex.m) {
            operator_delete((void *)entryIndex._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)header_1.d._M_dataplus._M_p != &header_1.d.field_2) goto LAB_00139bc8;
        }
      }
      else {
        bVar7 = Bstrlib::CBString::endsWith(&name,".met");
        if (bVar7) {
          usprintf((CBString *)&entryIndex,"Full size: %Xh (%u)\nHuffman compressed: ",
                   entry.d._M_string_length & 0xffffffff);
          pcVar14 = "Yes";
          if ((*(uint *)(((partitions.
                           super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName +
                        lVar21 + 0xc) >> 0x19 & 1) == 0) {
            pcVar14 = "No";
          }
          Bstrlib::CBString::operator+((CBString *)&header_1,(CBString *)&entryIndex,pcVar14);
          Bstrlib::CBString::operator=(&info,(CBString *)&header_1);
          Bstrlib::CBString::~CBString((CBString *)&header_1);
          Bstrlib::CBString::~CBString((CBString *)&entryIndex);
          header_1.d._M_dataplus._M_p = (pointer)paVar23;
          std::__cxx11::string::_M_construct((ulong)&header_1,' ');
          _Var15._M_p = (pointer)header_1.d._M_string_length;
          if (header_1.d._M_string_length != 0) {
            _Var15._M_p = header_1.d._M_dataplus._M_p;
          }
          sha256(entry.d._M_dataplus._M_p,(long)(int)entry.d._M_string_length,_Var15._M_p);
          Bstrlib::CBString::CBString((CBString *)&partitionIndex,"\nMetadata hash: ");
          UByteArray::toHex((UByteArray *)&entryIndex,&header_1);
          Bstrlib::CBString::CBString(&local_d0,(char *)entryIndex._0_8_);
          Bstrlib::CBString::operator+((CBString *)&local_138,(CBString *)&partitionIndex,&local_d0)
          ;
          Bstrlib::CBString::operator+=(&info,(CBString *)&local_138);
          Bstrlib::CBString::~CBString((CBString *)&local_138);
          Bstrlib::CBString::~CBString(&local_d0);
          if ((TreeModel **)entryIndex._0_8_ != &entryIndex.m) {
            operator_delete((void *)entryIndex._0_8_);
          }
          Bstrlib::CBString::~CBString((CBString *)&partitionIndex);
          pTVar4 = this->model;
          uVar22 = *(uint *)(((partitions.
                               super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName +
                            lVar21 + 0xc);
          Bstrlib::CBString::CBString(&local_d0);
          entryIndex._0_8_ = &entryIndex.m;
          entryIndex.i = 0;
          entryIndex.m._0_1_ = 0;
          local_138.d._M_string_length = 0;
          local_138.d.field_2._M_local_buf[0] = '\0';
          local_138.d._M_dataplus._M_p = (pointer)paVar1;
          TreeModel::addItem(&partitionIndex,pTVar4,(uVar22 & 0x1ffffff) + localOffset,'a',0xe7,
                             &name,&local_d0,&info,(UByteArray *)&entryIndex,&entry,&local_138,Fixed
                             ,parent,'\0');
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138.d._M_dataplus._M_p != paVar1) {
            operator_delete(local_138.d._M_dataplus._M_p);
          }
          if ((TreeModel **)entryIndex._0_8_ != &entryIndex.m) {
            operator_delete((void *)entryIndex._0_8_);
          }
          Bstrlib::CBString::~CBString(&local_d0);
          parseCpdExtensionsArea(this,&partitionIndex,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)header_1.d._M_dataplus._M_p != &header_1.d.field_2) {
LAB_00139bc8:
            operator_delete(header_1.d._M_dataplus._M_p);
          }
        }
        else {
          usprintf((CBString *)&entryIndex,"Full size: %Xh (%u)\nHuffman compressed: ",
                   entry.d._M_string_length & 0xffffffff);
          pcVar14 = "Yes";
          if ((*(uint *)(((partitions.
                           super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName +
                        lVar21 + 0xc) >> 0x19 & 1) == 0) {
            pcVar14 = "No";
          }
          Bstrlib::CBString::operator+((CBString *)&header_1,(CBString *)&entryIndex,pcVar14);
          Bstrlib::CBString::operator=(&info,(CBString *)&header_1);
          Bstrlib::CBString::~CBString((CBString *)&header_1);
          Bstrlib::CBString::~CBString((CBString *)&entryIndex);
          header_1.d._M_dataplus._M_p = (pointer)paVar23;
          std::__cxx11::string::_M_construct((ulong)&header_1,' ');
          _Var15._M_p = (pointer)header_1.d._M_string_length;
          if (header_1.d._M_string_length != 0) {
            _Var15._M_p = header_1.d._M_dataplus._M_p;
          }
          sha256(entry.d._M_dataplus._M_p,(long)(int)entry.d._M_string_length,_Var15._M_p);
          Bstrlib::CBString::CBString((CBString *)&partitionIndex,"\nHash: ");
          UByteArray::toHex((UByteArray *)&entryIndex,&header_1);
          Bstrlib::CBString::CBString(&local_d0,(char *)entryIndex._0_8_);
          Bstrlib::CBString::operator+((CBString *)&local_138,(CBString *)&partitionIndex,&local_d0)
          ;
          Bstrlib::CBString::operator+=(&info,(CBString *)&local_138);
          Bstrlib::CBString::~CBString((CBString *)&local_138);
          Bstrlib::CBString::~CBString(&local_d0);
          if ((TreeModel **)entryIndex._0_8_ != &entryIndex.m) {
            operator_delete((void *)entryIndex._0_8_);
          }
          Bstrlib::CBString::~CBString((CBString *)&partitionIndex);
          pTVar4 = this->model;
          uVar22 = *(uint *)(((partitions.
                               super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->ptEntry).EntryName +
                            lVar21 + 0xc);
          Bstrlib::CBString::CBString(&local_d0);
          entryIndex._0_8_ = &entryIndex.m;
          entryIndex.i = 0;
          entryIndex.m._0_1_ = 0;
          local_138.d._M_string_length = 0;
          local_138.d.field_2._M_local_buf[0] = '\0';
          local_138.d._M_dataplus._M_p = (pointer)paVar1;
          TreeModel::addItem(&partitionIndex,pTVar4,(uVar22 & 0x1ffffff) + localOffset,'a',0xe9,
                             &name,&local_d0,&info,(UByteArray *)&entryIndex,&entry,&local_138,Fixed
                             ,parent,'\0');
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138.d._M_dataplus._M_p != paVar1) {
            operator_delete(local_138.d._M_dataplus._M_p);
          }
          if ((TreeModel **)entryIndex._0_8_ != &entryIndex.m) {
            operator_delete((void *)entryIndex._0_8_);
          }
          Bstrlib::CBString::~CBString(&local_d0);
          parseRawArea(this,&partitionIndex);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)header_1.d._M_dataplus._M_p != &header_1.d.field_2) goto LAB_00139bc8;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)entry.d._M_dataplus._M_p != &entry.d.field_2) {
        operator_delete(entry.d._M_dataplus._M_p);
      }
    }
    uVar20 = uVar20 + 1;
    lVar21 = lVar21 + 0x38;
    pCVar17 = partitions.
              super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>._M_impl.
              super__Vector_impl_data._M_start;
  } while (uVar20 < (ulong)(((long)partitions.
                                   super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)partitions.
                                   super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           0x6db6db6db6db6db7));
LAB_00138cda:
  UVar16 = 0;
LAB_00138ce0:
  if (partitions.super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(partitions.
                    super__Vector_base<CPD_PARTITION_INFO_,_std::allocator<CPD_PARTITION_INFO_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  Bstrlib::CBString::~CBString(&info);
  Bstrlib::CBString::~CBString(&name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)body.d._M_dataplus._M_p != &body.d.field_2) {
    operator_delete(body.d._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)header.d._M_dataplus._M_p != &header.d.field_2) {
    operator_delete(header.d._M_dataplus._M_p);
  }
  return UVar16;
}

Assistant:

USTATUS FfsParser::parseCpdRegion(const UByteArray & region, const UINT32 localOffset, const UModelIndex & parent, UModelIndex & index)
{
    // Check directory size
    if ((UINT32)region.size() < sizeof(CPD_REV1_HEADER)) {
        msg(usprintf("%s: CPD too small to fit rev1 partition table header", __FUNCTION__), parent);
        return U_INVALID_ME_PARTITION_TABLE;
    }
    
    // Populate partition table header
    const CPD_REV1_HEADER* cpdHeader = (const CPD_REV1_HEADER*)region.constData();
    
    // Check header version to be known
    UINT32 ptHeaderSize = 0;
    if (cpdHeader->HeaderVersion == 2) {
        if ((UINT32)region.size() < sizeof(CPD_REV2_HEADER)) {
            msg(usprintf("%s: CPD too small to fit rev2 partition table header", __FUNCTION__), parent);
            return U_INVALID_ME_PARTITION_TABLE;
        }
        
        ptHeaderSize = sizeof(CPD_REV2_HEADER);
    }
    else if (cpdHeader->HeaderVersion == 1) {
        ptHeaderSize = sizeof(CPD_REV1_HEADER);
    }
    
    // Check directory size again
    UINT32 ptBodySize = cpdHeader->NumEntries * sizeof(CPD_ENTRY);
    UINT32 ptSize = ptHeaderSize + ptBodySize;
    if ((UINT32)region.size() < ptSize) {
        msg(usprintf("%s: CPD too small to fit the whole partition table", __FUNCTION__), parent);
        return U_INVALID_ME_PARTITION_TABLE;
    }
    
    // Get info
    UByteArray header = region.left(ptHeaderSize);
    UByteArray body = region.mid(ptHeaderSize, ptBodySize);
    UString name = usprintf("CPD partition table");
    UString info = usprintf("Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nNumber of entries: %u\n"
                            "Header version: %u\nEntry version: %u",
                            ptSize, ptSize,
                            (UINT32)header.size(), (UINT32)header.size(),
                            (UINT32)body.size(), (UINT32)body.size(),
                            cpdHeader->NumEntries,
                            cpdHeader->HeaderVersion,
                            cpdHeader->EntryVersion);
    
    // Add tree item
    index = model->addItem(localOffset, Types::CpdStore, 0, name, UString(), info, header, body, UByteArray(), Fixed, parent);
    
    // Add partition table entries
    std::vector<CPD_PARTITION_INFO> partitions;
    UINT32 offset = ptHeaderSize;
    const CPD_ENTRY* firstCpdEntry = (const CPD_ENTRY*)(body.constData());
    for (UINT32 i = 0; i < cpdHeader->NumEntries; i++) {
        // Populate entry header
        const CPD_ENTRY* cpdEntry = firstCpdEntry + i;
        UByteArray entry((const char*)cpdEntry, sizeof(CPD_ENTRY));
        
        // Get info
        name = usprintf("%.12s", cpdEntry->EntryName);
        info = usprintf("Full size: %Xh (%u)\nEntry offset: %Xh\nEntry length: %Xh\nHuffman compressed: ",
                        (UINT32)entry.size(), (UINT32)entry.size(),
                        cpdEntry->Offset.Offset,
                        cpdEntry->Length)
        + (cpdEntry->Offset.HuffmanCompressed ? "Yes" : "No");
        
        // Add tree item
        UModelIndex entryIndex = model->addItem(offset, Types::CpdEntry, 0, name, UString(), info, UByteArray(), entry, UByteArray(), Fixed, index);
        
        // Adjust offset
        offset += sizeof(CPD_ENTRY);
        
        if (cpdEntry->Offset.Offset != 0 && cpdEntry->Length != 0) {
            // Add to partitions vector
            CPD_PARTITION_INFO partition;
            partition.type = Types::CpdPartition;
            partition.ptEntry = *cpdEntry;
            partition.index = entryIndex;
            partition.hasMetaData = false;
            partitions.push_back(partition);
        }
    }
    
    // Add padding if there's no partions to add
    if (partitions.size() == 0) {
        UByteArray partition = region.mid(ptSize);
        
        // Get info
        name = UString("Padding");
        info = usprintf("Full size: %Xh (%u)",
                        (UINT32)partition.size(), (UINT32)partition.size());
        
        // Add tree item
        model->addItem(localOffset + ptSize, Types::Padding, getPaddingType(partition), name, UString(), info, UByteArray(), partition, UByteArray(), Fixed, parent);
        
        return U_SUCCESS;
    }
    
    // Sort partitions by offset
    std::sort(partitions.begin(), partitions.end());
    
    // Because lenghts for all Huffmann-compressed partitions mean nothing at all, we need to split all partitions into 2 classes:
    // 1. CPD manifest
    // 2. Metadata entries
    UINT32 i = 1; // manifest is index 0, .met partitions start at index 1
    while (i < partitions.size()) {
        name = usprintf("%.12s", partitions[i].ptEntry.EntryName);
        
        // Check if the current entry is metadata entry
        if (!name.endsWith(".met")) {
            // No need to parse further, all metadata partitions are parsed
            break;
        }
        
        // Parse into data block, find Module Attributes extension, and get compressed size from there
        UINT32 offset = 0;
        UINT32 length = 0xFFFFFFFF; // Special guardian value
        UByteArray partition = region.mid(partitions[i].ptEntry.Offset.Offset, partitions[i].ptEntry.Length);
        while (offset < (UINT32)partition.size()) {
            const CPD_EXTENTION_HEADER* extHeader = (const CPD_EXTENTION_HEADER*) (partition.constData() + offset);
            if (extHeader->Length <= ((UINT32)partition.size() - offset)) {
                if (extHeader->Type == CPD_EXT_TYPE_MODULE_ATTRIBUTES) {
                    const CPD_EXT_MODULE_ATTRIBUTES* attrHeader = (const CPD_EXT_MODULE_ATTRIBUTES*)(partition.constData() + offset);
                    length = attrHeader->CompressedSize;
                }
                offset += extHeader->Length;
            }
            else break;
        }
        
        // Search down for corresponding code partition
        // Construct its name by removing the .met suffix
        name.chop(4);
        
        // Search
        bool found = false;
        UINT32 j = 1;
        while (j < partitions.size()) {
            UString namej = usprintf("%.12s", partitions[j].ptEntry.EntryName);
            
            if (name == namej) {
                found = true;
                // Found it, update its Length if needed
                if (partitions[j].ptEntry.Offset.HuffmanCompressed) {
                    partitions[j].ptEntry.Length = length;
                }
                else if (length != 0xFFFFFFFF && partitions[j].ptEntry.Length != length) {
                    msg(usprintf("%s: partition size mismatch between partition table (%Xh) and partition metadata (%Xh)", __FUNCTION__,
                                 partitions[j].ptEntry.Length, length), partitions[j].index);
                    partitions[j].ptEntry.Length = length; // Believe metadata
                }
                partitions[j].hasMetaData = true;
                // No need to search further
                break;
            }
            // Check the next partition
            j++;
        }
        if (!found) {
            msg(usprintf("%s: no code partition", __FUNCTION__), partitions[i].index);
        }
        
        // Check the next partition
        i++;
    }
    
make_partition_table_consistent:
    if (partitions.empty()) {
        return U_INVALID_ME_PARTITION_TABLE;
    }
    // Sort partitions by offset
    std::sort(partitions.begin(), partitions.end());
    
    // Check for intersections and paddings between partitions
    CPD_PARTITION_INFO padding = {};
    
    // Check intersection with the partition table header
    if (partitions.front().ptEntry.Offset.Offset < ptSize) {
        msg(usprintf("%s: CPD partition has intersection with CPD partition table, skipped", __FUNCTION__),
            partitions.front().index);
        partitions.erase(partitions.begin());
        goto make_partition_table_consistent;
    }
    // Check for padding between partition table and the first partition
    else if (partitions.front().ptEntry.Offset.Offset > ptSize) {
        padding.ptEntry.Offset.Offset = ptSize;
        padding.ptEntry.Length = partitions.front().ptEntry.Offset.Offset - padding.ptEntry.Offset.Offset;
        padding.type = Types::Padding;
        partitions.insert(partitions.begin(), padding);
    }
    // Check for intersections/paddings between partitions
    for (size_t i = 1; i < partitions.size(); i++) {
        UINT32 previousPartitionEnd = partitions[i - 1].ptEntry.Offset.Offset + partitions[i - 1].ptEntry.Length;
        
        // Check that current region is fully present in the image
        if ((UINT64)partitions[i].ptEntry.Offset.Offset + (UINT64)partitions[i].ptEntry.Length > (UINT64)region.size()) {
            if ((UINT64)partitions[i].ptEntry.Offset.Offset >= (UINT64)region.size()) {
                msg(usprintf("%s: CPD partition is located outside of the opened image, skipped", __FUNCTION__), partitions[i].index);
                partitions.erase(partitions.begin() + i);
                goto make_partition_table_consistent;
            }
            else {
                if (!partitions[i].hasMetaData && partitions[i].ptEntry.Offset.HuffmanCompressed) {
                    msg(usprintf("%s: CPD partition is compressed but doesn't have metadata and can't fit into its region, length adjusted", __FUNCTION__),
                        partitions[i].index);
                }
                else {
                    msg(usprintf("%s: CPD partition can't fit into its region, truncated", __FUNCTION__), partitions[i].index);
                }
                partitions[i].ptEntry.Length = (UINT32)region.size() - (UINT32)partitions[i].ptEntry.Offset.Offset;
            }
        }
        
        // Check for intersection with previous partition
        if (partitions[i].ptEntry.Offset.Offset < previousPartitionEnd) {
            // Check if previous partition was compressed but did not have metadata
            if (!partitions[i - 1].hasMetaData && partitions[i - 1].ptEntry.Offset.HuffmanCompressed) {
                msg(usprintf("%s: CPD partition is compressed but doesn't have metadata, length adjusted", __FUNCTION__),
                    partitions[i - 1].index);
                partitions[i - 1].ptEntry.Length = (UINT32)partitions[i].ptEntry.Offset.Offset - (UINT32)partitions[i - 1].ptEntry.Offset.Offset;
                goto make_partition_table_consistent;
            }
            
            // Check if current partition is located inside previous one
            if (partitions[i].ptEntry.Offset.Offset + partitions[i].ptEntry.Length <= previousPartitionEnd) {
                msg(usprintf("%s: CPD partition is located inside another CPD partition, skipped", __FUNCTION__),
                    partitions[i].index);
                partitions.erase(partitions.begin() + i);
                goto make_partition_table_consistent;
            }
            else {
                msg(usprintf("%s: CPD partition intersects with previous one, skipped", __FUNCTION__),
                    partitions[i].index);
                partitions.erase(partitions.begin() + i);
                goto make_partition_table_consistent;
            }
        }
        // Check for padding between current and previous partitions
        else if (partitions[i].ptEntry.Offset.Offset > previousPartitionEnd) {
            padding.ptEntry.Offset.Offset = previousPartitionEnd;
            padding.ptEntry.Length = partitions[i].ptEntry.Offset.Offset - previousPartitionEnd;
            padding.type = Types::Padding;
            std::vector<CPD_PARTITION_INFO>::iterator iter = partitions.begin();
            std::advance(iter, i);
            partitions.insert(iter, padding);
        }
    }
    // Check for padding after the last region
    if ((UINT64)partitions.back().ptEntry.Offset.Offset + (UINT64)partitions.back().ptEntry.Length < (UINT64)region.size()) {
        padding.ptEntry.Offset.Offset = partitions.back().ptEntry.Offset.Offset + partitions.back().ptEntry.Length;
        padding.ptEntry.Length = (UINT32)region.size() - padding.ptEntry.Offset.Offset;
        padding.type = Types::Padding;
        partitions.push_back(padding);
    }
    
    // Partition map is consistent
    for (size_t i = 0; i < partitions.size(); i++) {
        if (partitions[i].type == Types::CpdPartition) {
            UByteArray partition = region.mid(partitions[i].ptEntry.Offset.Offset, partitions[i].ptEntry.Length);
            
            // Get info
            name = usprintf("%.12s", partitions[i].ptEntry.EntryName);
            
            // It's a manifest
            if (name.endsWith(".man")) {
                if (!partitions[i].ptEntry.Offset.HuffmanCompressed
                    && partitions[i].ptEntry.Length >= sizeof(CPD_MANIFEST_HEADER)) {
                    const CPD_MANIFEST_HEADER* manifestHeader = (const CPD_MANIFEST_HEADER*) partition.constData();
                    if (manifestHeader->HeaderId == ME_MANIFEST_HEADER_ID) {
                        UByteArray header = partition.left(manifestHeader->HeaderLength * sizeof(UINT32));
                        UByteArray body = partition.mid(manifestHeader->HeaderLength * sizeof(UINT32));
                        
                        info = usprintf("Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)"
                                        "\nHeader type: %u\nHeader length: %Xh (%u)\nHeader version: %Xh\nFlags: %08Xh\nVendor: %Xh\n"
                                        "Date: %Xh\nSize: %Xh (%u)\nVersion: %u.%u.%u.%u\nSecurity version number: %u\nModulus size: %Xh (%u)\nExponent size: %Xh (%u)",
                                        (UINT32)partition.size(), (UINT32)partition.size(),
                                        (UINT32)header.size(), (UINT32)header.size(),
                                        (UINT32)body.size(), (UINT32)body.size(),
                                        manifestHeader->HeaderType,
                                        manifestHeader->HeaderLength * (UINT32)sizeof(UINT32), manifestHeader->HeaderLength * (UINT32)sizeof(UINT32),
                                        manifestHeader->HeaderVersion,
                                        manifestHeader->Flags,
                                        manifestHeader->Vendor,
                                        manifestHeader->Date,
                                        manifestHeader->Size * (UINT32)sizeof(UINT32), manifestHeader->Size * (UINT32)sizeof(UINT32),
                                        manifestHeader->VersionMajor, manifestHeader->VersionMinor, manifestHeader->VersionBugfix, manifestHeader->VersionBuild,
                                        manifestHeader->SecurityVersion,
                                        manifestHeader->ModulusSize * (UINT32)sizeof(UINT32), manifestHeader->ModulusSize * (UINT32)sizeof(UINT32),
                                        manifestHeader->ExponentSize * (UINT32)sizeof(UINT32), manifestHeader->ExponentSize * (UINT32)sizeof(UINT32));
                        
                        // Add tree item
                        UModelIndex partitionIndex = model->addItem(localOffset + partitions[i].ptEntry.Offset.Offset, Types::CpdPartition, Subtypes::ManifestCpdPartition, name, UString(), info, header, body, UByteArray(), Fixed, parent);
                        
                        // Parse data as extensions area
                        // Add the header size as a local offset
                        // Since the body starts after the header length
                        parseCpdExtensionsArea(partitionIndex, (UINT32)header.size());
                    }
                }
            }
            // It's a metadata
            else if (name.endsWith(".met")) {
                info = usprintf("Full size: %Xh (%u)\nHuffman compressed: ",
                                (UINT32)partition.size(), (UINT32)partition.size())
                + (partitions[i].ptEntry.Offset.HuffmanCompressed ? "Yes" : "No");
                
                // Calculate SHA256 hash over the metadata and add it to its info
                UByteArray hash(SHA256_HASH_SIZE, '\x00');
                sha256(partition.constData(), partition.size(), hash.data());
                info += UString("\nMetadata hash: ") + UString(hash.toHex().constData());
                
                // Add three item
                UModelIndex partitionIndex = model->addItem(localOffset + partitions[i].ptEntry.Offset.Offset, Types::CpdPartition,  Subtypes::MetadataCpdPartition, name, UString(), info, UByteArray(), partition, UByteArray(), Fixed, parent);
                
                // Parse data as extensions area
                parseCpdExtensionsArea(partitionIndex, 0);
            }
            // It's a code
            else {
                info = usprintf("Full size: %Xh (%u)\nHuffman compressed: ",
                                (UINT32)partition.size(), (UINT32)partition.size())
                + (partitions[i].ptEntry.Offset.HuffmanCompressed ? "Yes" : "No");
                
                // Calculate SHA256 hash over the code and add it to its info
                UByteArray hash(SHA256_HASH_SIZE, '\x00');
                sha256(partition.constData(), partition.size(), hash.data());
                info += UString("\nHash: ") + UString(hash.toHex().constData());
                
                UModelIndex codeIndex = model->addItem(localOffset + partitions[i].ptEntry.Offset.Offset, Types::CpdPartition, Subtypes::CodeCpdPartition, name, UString(), info, UByteArray(), partition, UByteArray(), Fixed, parent);
                (void)parseRawArea(codeIndex);
            }
        }
        else if (partitions[i].type == Types::Padding) {
            UByteArray partition = region.mid(partitions[i].ptEntry.Offset.Offset, partitions[i].ptEntry.Length);
            
            // Get info
            name = UString("Padding");
            info = usprintf("Full size: %Xh (%u)", (UINT32)partition.size(), (UINT32)partition.size());
            
            // Add tree item
            model->addItem(localOffset + partitions[i].ptEntry.Offset.Offset, Types::Padding, getPaddingType(partition), name, UString(), info, UByteArray(), partition, UByteArray(), Fixed, parent);
        }
        else {
            msg(usprintf("%s: CPD partition of unknown type found", __FUNCTION__), parent);
            return U_INVALID_ME_PARTITION_TABLE;
        }
    }
    
    return U_SUCCESS;
}